

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::record_value_if_available<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,maybe<pstore::command_line::option_*,_void> *handler,
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *value,string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  option **ppoVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  ostream *poVar7;
  czstring pcVar8;
  maybe<pstore::command_line::option_*,_void> local_48;
  bool local_31;
  string *psStack_30;
  bool ok;
  basic_ostream<char,_std::char_traits<char>_> *errs_local;
  string *program_name_local;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *value_local;
  maybe<pstore::command_line::option_*,_void> *handler_local;
  
  local_31 = true;
  psStack_30 = program_name;
  errs_local = (basic_ostream<char,_std::char_traits<char>_> *)value;
  program_name_local = (string *)handler;
  value_local = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)this;
  handler_local = (maybe<pstore::command_line::option_*,_void> *)__return_storage_ptr__;
  ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                      ((maybe<pstore::command_line::option_*,_void> *)this);
  uVar2 = (*(*ppoVar4)->_vptr_option[0xe])();
  if ((uVar2 & 1) == 0) {
    bVar1 = maybe::operator_cast_to_bool((maybe *)program_name_local);
    poVar7 = (ostream *)psStack_30;
    if (bVar1) {
      psVar6 = stream_trait<char>::out_string((string *)errs_local);
      poVar7 = std::operator<<(poVar7,(string *)psVar6);
      pcVar8 = stream_trait<char>::out_text(": Argument \'");
      poVar7 = std::operator<<(poVar7,pcVar8);
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      psVar6 = option::name_abi_cxx11_(*ppoVar4);
      psVar6 = stream_trait<char>::out_string(psVar6);
      poVar7 = std::operator<<(poVar7,(string *)psVar6);
      pcVar8 = stream_trait<char>::out_text("\' does not take a value\n");
      std::operator<<(poVar7,pcVar8);
      local_31 = false;
    }
    else {
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      iVar3 = (*(*ppoVar4)->_vptr_option[0x10])();
      local_31 = (bool)((byte)iVar3 & 1);
      maybe<pstore::command_line::option_*,_void>::reset
                ((maybe<pstore::command_line::option_*,_void> *)this);
    }
  }
  else {
    bVar1 = maybe::operator_cast_to_bool((maybe *)program_name_local);
    if (bVar1) {
      maybe<pstore::command_line::option_*,_void>::maybe
                (&local_48,(maybe<pstore::command_line::option_*,_void> *)this);
      pbVar5 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::operator*((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                            *)program_name_local);
      bVar1 = handler_set_value(&local_48,pbVar5);
      maybe<pstore::command_line::option_*,_void>::~maybe(&local_48);
      poVar7 = (ostream *)psStack_30;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        psVar6 = stream_trait<char>::out_string((string *)errs_local);
        poVar7 = std::operator<<(poVar7,(string *)psVar6);
        pcVar8 = stream_trait<char>::out_text(": Unknown value \'");
        poVar7 = std::operator<<(poVar7,pcVar8);
        pbVar5 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 ::operator*((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                              *)program_name_local);
        psVar6 = stream_trait<char>::out_string(pbVar5);
        poVar7 = std::operator<<(poVar7,(string *)psVar6);
        pcVar8 = stream_trait<char>::out_text("\'");
        std::operator<<(poVar7,pcVar8);
        local_31 = false;
      }
      maybe<pstore::command_line::option_*,_void>::reset
                ((maybe<pstore::command_line::option_*,_void> *)this);
    }
  }
  std::make_tuple<pstore::maybe<pstore::command_line::option*,void>,bool&>
            (__return_storage_ptr__,(maybe<pstore::command_line::option_*,_void> *)this,&local_31);
  return __return_storage_ptr__;
}

Assistant:

auto record_value_if_available (maybe<option *> handler,
                                            maybe<std::string> const & value,
                                            std::string const & program_name, ErrorStream & errs)
                -> std::tuple<maybe<option *>, bool> {
                using str = stream_trait<typename ErrorStream::char_type>;
                bool ok = true;
                if ((*handler)->takes_argument ()) {
                    if (value) {
                        if (!handler_set_value (handler, *value)) {
                            errs << str::out_string (program_name)
                                 << str::out_text (": Unknown value '") << str::out_string (*value)
                                 << str::out_text ("'");
                            ok = false;
                        }
                        handler.reset ();
                    } else {
                        // The option takes an argument but we haven't yet seen the value
                        // string.
                    }
                } else {
                    if (value) {
                        // We got a value but don't want one.
                        errs << str::out_string (program_name) << str::out_text (": Argument '")
                             << str::out_string ((*handler)->name ())
                             << str::out_text ("' does not take a value\n");
                        ok = false;
                    } else {
                        ok = (*handler)->add_occurrence ();
                        handler.reset ();
                    }
                }
                return std::make_tuple (std::move (handler), ok);
            }